

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
jsoncons::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,byte_string_view *bstr)

{
  byte bVar1;
  long lVar2;
  size_t sVar3;
  uint8_t *puVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  bool bVar6;
  size_t sVar7;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ss;
  undefined1 auStack_1d8 [8];
  char local_1d0;
  undefined7 uStack_1cf;
  long local_1c8;
  long local_1c0 [2];
  basic_ostream<char,_std::char_traits<char>_> *local_1b0;
  long local_1a8 [2];
  undefined8 uStack_198;
  undefined4 auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(undefined4 *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) = 8;
  lVar2 = *(long *)(local_1a8[0] + -0x18);
  if (acStack_c8[lVar2 + 1] == '\0') {
    std::ios::widen((char)auStack_1d8 + (char)lVar2 + '0');
    acStack_c8[lVar2 + 1] = '\x01';
  }
  acStack_c8[lVar2] = '0';
  sVar3 = bstr->size_;
  local_1b0 = os;
  if (sVar3 != 0) {
    puVar4 = bstr->data_;
    bVar6 = true;
    sVar7 = 0;
    do {
      bVar1 = puVar4[sVar7];
      if (!bVar6) {
        local_1d0 = ',';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1d0,1);
      }
      *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
      std::ostream::operator<<((ostream *)local_1a8,(uint)bVar1);
      sVar7 = sVar7 + 1;
      bVar6 = false;
    } while (sVar3 != sVar7);
  }
  std::__cxx11::stringbuf::str();
  pbVar5 = local_1b0;
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1b0,(char *)CONCAT71(uStack_1cf,local_1d0),local_1c8);
  if ((long *)CONCAT71(uStack_1cf,local_1d0) != local_1c0) {
    operator_delete((long *)CONCAT71(uStack_1cf,local_1d0),local_1c0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return pbVar5;
}

Assistant:

std::basic_ostream<CharT>& operator<<(std::basic_ostream<CharT>& os, const byte_string_view& bstr)
        {
            std::basic_ostringstream<CharT> ss;
            ss.flags(std::ios::hex);
            ss.fill('0');

            bool first = true;
            for (auto b : bstr)
            {
                if (first)
                {
                    first = false;
                }
                else 
                {
                    ss << ',';
                }
                ss << std::setw(2) << static_cast<int>(b);
            }
            os << ss.str();
            return os;
        }